

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decFactor.c
# Opt level: O2

Dec_Edge_t Dec_FactorTrivialTree_rec(Dec_Graph_t *pFForm,Dec_Edge_t *peNodes,int nNodes,int fNodeOr)

{
  int nNodes_00;
  Dec_Edge_t DVar1;
  Dec_Edge_t eEdge1;
  
  if (nNodes == 1) {
    return *peNodes;
  }
  nNodes_00 = nNodes / 2;
  DVar1 = Dec_FactorTrivialTree_rec(pFForm,peNodes,nNodes_00,fNodeOr);
  eEdge1 = Dec_FactorTrivialTree_rec(pFForm,peNodes + nNodes_00,nNodes - nNodes_00,fNodeOr);
  if (fNodeOr != 0) {
    DVar1 = Dec_GraphAddNodeOr(pFForm,DVar1,eEdge1);
    return DVar1;
  }
  DVar1 = Dec_GraphAddNodeAnd(pFForm,DVar1,eEdge1);
  return DVar1;
}

Assistant:

Dec_Edge_t Dec_FactorTrivialTree_rec( Dec_Graph_t * pFForm, Dec_Edge_t * peNodes, int nNodes, int fNodeOr )
{
    Dec_Edge_t eNode1, eNode2;
    int nNodes1, nNodes2;

    if ( nNodes == 1 )
        return peNodes[0];

    // split the nodes into two parts
    nNodes1 = nNodes/2;
    nNodes2 = nNodes - nNodes1;
//    nNodes2 = nNodes/2;
//    nNodes1 = nNodes - nNodes2;

    // recursively construct the tree for the parts
    eNode1 = Dec_FactorTrivialTree_rec( pFForm, peNodes,           nNodes1, fNodeOr );
    eNode2 = Dec_FactorTrivialTree_rec( pFForm, peNodes + nNodes1, nNodes2, fNodeOr );

    if ( fNodeOr )
        return Dec_GraphAddNodeOr( pFForm, eNode1, eNode2 );
    else
        return Dec_GraphAddNodeAnd( pFForm, eNode1, eNode2 );
}